

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

int __thiscall World::CheckBan(World *this,string *username,IPAddress *address,int *hdid)

{
  uint uVar1;
  char *format;
  time_t tVar2;
  reference this_00;
  mapped_type *this_01;
  int subject;
  int subject_00;
  allocator<char> local_149;
  key_type local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  Database_Result res;
  string local_a8;
  string local_88;
  undefined4 local_68;
  allocator<char> local_51;
  string local_50 [8];
  string query;
  int *hdid_local;
  IPAddress *address_local;
  string *username_local;
  World *this_local;
  
  query.field_2._8_8_ = hdid;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"SELECT COALESCE(MAX(expires),-1) AS expires FROM bans WHERE (",&local_51);
  std::allocator<char>::~allocator(&local_51);
  if (((username == (string *)0x0) && (address == (IPAddress *)0x0)) && (query.field_2._8_8_ == 0))
  {
    this_local._4_4_ = -1;
    local_68 = 1;
  }
  else {
    if (username != (string *)0x0) {
      std::__cxx11::string::operator+=(local_50,"username = \'");
      Database::Escape(&local_88,&this->db,username);
      std::__cxx11::string::operator+=(local_50,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::operator+=(local_50,"\' OR ");
    }
    if (address != (IPAddress *)0x0) {
      std::__cxx11::string::operator+=(local_50,"ip = ");
      uVar1 = IPAddress::operator_cast_to_unsigned_int(address);
      util::to_string_abi_cxx11_(&local_a8,(util *)(ulong)uVar1,subject);
      std::__cxx11::string::operator+=(local_50,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::operator+=(local_50," OR ");
    }
    if (query.field_2._8_8_ != 0) {
      std::__cxx11::string::operator+=(local_50,"hdid = ");
      util::to_string_abi_cxx11_
                ((string *)&res.affected_rows,(util *)(ulong)*(uint *)query.field_2._8_8_,subject_00
                );
      std::__cxx11::string::operator+=(local_50,(string *)&res.affected_rows);
      std::__cxx11::string::~string((string *)&res.affected_rows);
      std::__cxx11::string::operator+=(local_50," OR ");
    }
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_128,(ulong)local_50);
    std::operator+(&local_108,&local_128,") AND (expires > # OR expires = 0)");
    format = (char *)std::__cxx11::string::c_str();
    tVar2 = time((time_t *)0x0);
    Database::Query((Database_Result *)local_e8,&this->db,format,tVar2);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    this_00 = std::
              vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
              ::operator[]((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                            *)local_e8,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"expires",&local_149);
    this_01 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](this_00,&local_148);
    this_local._4_4_ = util::variant::operator_cast_to_int(this_01);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    local_68 = 1;
    Database_Result::~Database_Result((Database_Result *)local_e8);
  }
  std::__cxx11::string::~string(local_50);
  return this_local._4_4_;
}

Assistant:

int World::CheckBan(const std::string *username, const IPAddress *address, const int *hdid)
{
	std::string query("SELECT COALESCE(MAX(expires),-1) AS expires FROM bans WHERE (");

	if (!username && !address && !hdid)
	{
		return -1;
	}

	if (username)
	{
		query += "username = '";
		query += db.Escape(*username);
		query += "' OR ";
	}

	if (address)
	{
		query += "ip = ";
		query += util::to_string(static_cast<int>(*const_cast<IPAddress *>(address)));
		query += " OR ";
	}

	if (hdid)
	{
		query += "hdid = ";
		query += util::to_string(*hdid);
		query += " OR ";
	}

	Database_Result res = db.Query((query.substr(0, query.length()-4) + ") AND (expires > # OR expires = 0)").c_str(), int(std::time(0)));

	return static_cast<int>(res[0]["expires"]);
}